

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void do_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
               jvirt_barray_ptr *src_coef_arrays,JDIMENSION drop_width,JDIMENSION drop_height)

{
  JBLOCKROW paJVar1;
  jpeg_component_info *pjVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  uint uVar7;
  int iVar8;
  JBLOCKARRAY ppaJVar9;
  JBLOCKROW paJVar10;
  JDIMENSION JVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  JBLOCKROW paJVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  JDIMENSION JVar22;
  undefined4 uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar25 [16];
  
  iVar8 = dstinfo->num_components;
  if (0 < iVar8) {
    lVar18 = 0;
    do {
      pjVar2 = dstinfo->comp_info;
      JVar11 = pjVar2[lVar18].v_samp_factor;
      uVar19 = JVar11 * drop_height;
      if (uVar19 != 0) {
        uVar20 = pjVar2[lVar18].h_samp_factor * x_crop_offset;
        uVar21 = pjVar2[lVar18].h_samp_factor * drop_width;
        JVar22 = 0;
        do {
          ppaJVar9 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar18],JVar22,JVar11,1);
          JVar11 = pjVar2[lVar18].v_samp_factor;
          if (0 < (int)JVar11) {
            lVar14 = 0;
            do {
              if (uVar20 == 0) {
                uVar16 = pjVar2[lVar18].width_in_blocks - uVar21;
                if (pjVar2[lVar18].width_in_blocks < uVar21 || uVar16 == 0) {
                  memset(ppaJVar9[lVar14],0,(ulong)uVar21 * 0x80);
                  JVar11 = pjVar2[lVar18].v_samp_factor;
                }
                else if (uVar21 != 0) {
                  paJVar15 = ppaJVar9[lVar14] + uVar21;
                  uVar12 = uVar16;
                  paJVar10 = paJVar15;
                  uVar13 = uVar21;
                  uVar7 = uVar16;
joined_r0x00140529:
                  do {
                    if (uVar7 != 0) {
                      paJVar1 = paJVar15 + -1;
                      lVar17 = -0x20;
                      do {
                        auVar23 = *(undefined1 (*) [16])(paJVar10[1] + lVar17 * 2);
                        auVar28 = pshuflw(in_XMM1,auVar23,0xe7);
                        auVar28 = pshufhw(auVar28,auVar28,0xe7);
                        auVar30._0_4_ = auVar28._0_4_;
                        auVar30._8_4_ = auVar28._8_4_;
                        auVar30._12_4_ = auVar28._12_4_;
                        auVar30._4_4_ = auVar30._8_4_;
                        in_XMM1 = pshuflw(auVar30,auVar30,0xb1);
                        auVar23 = pshuflw(auVar23,auVar23,0xe8);
                        auVar23 = pshufhw(auVar23,auVar23,0xe8);
                        uVar27 = auVar23._8_4_;
                        auVar26._0_10_ = (unkuint10)CONCAT44(uVar27,uVar27) << 0x20;
                        auVar6._8_2_ = auVar23._10_2_;
                        auVar6._0_8_ = CONCAT44(uVar27,uVar27);
                        auVar6._10_2_ = -in_XMM1._6_2_;
                        auVar26._12_4_ = auVar6._8_4_;
                        auVar26._10_2_ = -in_XMM1._4_2_;
                        auVar4._4_2_ = auVar23._8_2_;
                        auVar4._0_4_ = uVar27;
                        auVar4._6_6_ = auVar26._10_6_;
                        auVar28._8_8_ = auVar4._4_8_;
                        auVar28._6_2_ = -in_XMM1._2_2_;
                        auVar28._4_2_ = auVar23._2_2_;
                        auVar28._0_2_ = auVar23._0_2_;
                        auVar28._2_2_ = -in_XMM1._0_2_;
                        *(undefined1 (*) [16])(*paJVar15 + lVar17 * 2) = auVar28;
                        lVar17 = lVar17 + 4;
                      } while (lVar17 != 0);
                      uVar13 = uVar13 - 1;
                      paJVar15 = paJVar1;
                      if (uVar12 - 1 != 0) {
                        uVar12 = uVar12 - 1;
                        paJVar10 = paJVar10 + 1;
                        uVar7 = uVar13;
                        goto joined_r0x00140529;
                      }
                    }
                    uVar12 = uVar16;
                    paJVar10 = paJVar15;
                    uVar7 = uVar16;
                  } while (uVar13 != 0);
                }
              }
              else if (uVar21 != 0) {
                paJVar10 = ppaJVar9[lVar14] + uVar20;
                paJVar15 = paJVar10;
                uVar16 = uVar20;
                uVar12 = uVar21;
                do {
                  lVar17 = 0;
                  do {
                    auVar23 = *(undefined1 (*) [16])(paJVar15[-1] + lVar17 * 2);
                    auVar28 = pshuflw(in_XMM1,auVar23,0xe7);
                    auVar28 = pshufhw(auVar28,auVar28,0xe7);
                    auVar29._0_4_ = auVar28._0_4_;
                    auVar29._8_4_ = auVar28._8_4_;
                    auVar29._12_4_ = auVar28._12_4_;
                    auVar29._4_4_ = auVar29._8_4_;
                    in_XMM1 = pshuflw(auVar29,auVar29,0xb1);
                    auVar23 = pshuflw(auVar23,auVar23,0xe8);
                    auVar23 = pshufhw(auVar23,auVar23,0xe8);
                    uVar27 = auVar23._8_4_;
                    auVar25._0_10_ = (unkuint10)CONCAT44(uVar27,uVar27) << 0x20;
                    auVar5._8_2_ = auVar23._10_2_;
                    auVar5._0_8_ = CONCAT44(uVar27,uVar27);
                    auVar5._10_2_ = -in_XMM1._6_2_;
                    auVar25._12_4_ = auVar5._8_4_;
                    auVar25._10_2_ = -in_XMM1._4_2_;
                    auVar3._4_2_ = auVar23._8_2_;
                    auVar3._0_4_ = uVar27;
                    auVar3._6_6_ = auVar25._10_6_;
                    auVar24._8_8_ = auVar3._4_8_;
                    auVar24._6_2_ = -in_XMM1._2_2_;
                    auVar24._4_2_ = auVar23._2_2_;
                    auVar24._0_2_ = auVar23._0_2_;
                    auVar24._2_2_ = -in_XMM1._0_2_;
                    *(undefined1 (*) [16])(*paJVar10 + lVar17 * 2) = auVar24;
                    lVar17 = lVar17 + 4;
                  } while (lVar17 != 0x20);
                  paJVar10 = paJVar10 + 1;
                  uVar16 = uVar16 - 1;
                  uVar12 = uVar12 - 1;
                  paJVar15 = paJVar15 + -1;
                } while ((uVar16 != 0 && uVar12 != 0) ||
                        (paJVar15 = paJVar10, uVar16 = uVar20, uVar12 != 0));
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (int)JVar11);
          }
          JVar22 = JVar22 + JVar11;
        } while (JVar22 < uVar19);
        iVar8 = dstinfo->num_components;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar8);
  }
  return;
}

Assistant:

LOCAL(void)
do_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
           JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays,
           JDIMENSION drop_width, JDIMENSION drop_height)
/* Reflect - discard image contents of specified region, similarly to wipe,
 * but fill with repeated reflections of the outside region instead of zero.
 * NB: y_crop_offset is assumed to be zero.
 */
{
  JDIMENSION x_wipe_blocks, wipe_width;
  JDIMENSION y_wipe_blocks, wipe_bottom;
  JDIMENSION src_blk_x, dst_blk_x;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_wipe_blocks = x_crop_offset * compptr->h_samp_factor;
    wipe_width = drop_width * compptr->h_samp_factor;
    wipe_bottom = drop_height * compptr->v_samp_factor;
    for (y_wipe_blocks = 0; y_wipe_blocks < wipe_bottom;
         y_wipe_blocks += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], y_wipe_blocks,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_wipe_blocks > 0) {
          /* Reflect from left */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            for (src_blk_x = x_wipe_blocks;
                 src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;    /* destination goes right */
              src_ptr = *(--src_row_ptr);  /* source goes left */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else if (compptr->width_in_blocks > x_wipe_blocks + wipe_width) {
          /* Reflect from right */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks + wipe_width;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            src_blk_x = compptr->width_in_blocks - x_wipe_blocks - wipe_width;
            for (; src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);  /* destination goes left */
              src_ptr = *src_row_ptr++;    /* source goes right */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else {
          MEMZERO(buffer[offset_y] + x_wipe_blocks,
                  wipe_width * sizeof(JBLOCK));
        }
      }
    }
  }
}